

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::TagInfo::all_abi_cxx11_(string *__return_storage_ptr__,TagInfo *this)

{
  bool bVar1;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  const_iterator itEnd;
  const_iterator it;
  TagInfo *this_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  itEnd._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->spellings);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->spellings);
  while (bVar1 = std::operator!=(&itEnd,&local_30), bVar1) {
    __rhs = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&itEnd);
    std::operator+(&local_70,"[",__rhs);
    std::operator+(&local_50,&local_70,"]");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&itEnd);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string all() const {
            std::string out;
            for( std::set<std::string>::const_iterator it = spellings.begin(), itEnd = spellings.end();
                        it != itEnd;
                        ++it )
                out += "[" + *it + "]";
            return out;
        }